

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void gameTick(int *isOnGround,int *isOnStairs)

{
  Actor *actor;
  void *item_00;
  char *pcVar1;
  int iVar2;
  Vec2i *item_01;
  Actor *foe_2;
  int dy;
  int dx;
  Actor *a;
  Actor *foe_1;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  Item *local_48;
  Item *item;
  Actor *foe;
  Actor *arrow;
  size_t pos2;
  size_t pos;
  uint *puStack_18;
  int ceiling;
  int *isOnStairs_local;
  int *isOnGround_local;
  
  arrow = (Actor *)0x0;
  counter = counter + 1;
  if (screen == kGame) {
    puStack_18 = (uint *)isOnStairs;
    isOnStairs_local = isOnGround;
    updateTimers();
    if (player.mHealth == 0) {
      screen = kGameOver;
      prepareScreenFor(kGameOver);
    }
    else {
      if (player.mStance == kAttacking) {
        evaluatePlayerAttack();
        player.mStance = kStanding;
      }
      *puStack_18 = (uint)(foregroundTiles[(player.mPosition.mY + 0x10) / 0x20]
                           [(player.mPosition.mX + 0x10) / 0x20] == 3);
      iVar2 = isBlockedByWall(&player);
      if (iVar2 != 0) {
        player.mSpeed.mX = 0;
      }
      iVar2 = isOnHarmfulBlock(&player);
      if ((iVar2 != 0) && (ticksUntilVulnerable < 1)) {
        hurtPlayer(1);
      }
      iVar2 = isOnDoor(&player);
      if (iVar2 != 0) {
        advanceFloor();
      }
      player.mPosition.mX = player.mSpeed.mX + player.mPosition.mX;
      player.mPosition.mY = player.mSpeed.mY + player.mPosition.mY;
      if (player.mSpeed.mX == 1) {
        player.mSpeed.mX = 0;
      }
      if (player.mSpeed.mY == 1) {
        player.mSpeed.mY = 0;
      }
      enforceScreenLimits();
      if (((player.mSpeed.mX == 0) && (player.mSpeed.mY == 0)) && (player.mStance != kAltAttacking))
      {
        heroFrame = 0;
      }
      pos._4_4_ = player.mPosition.mY / 0x20;
      iVar2 = isOnFloor(&player);
      *isOnStairs_local = iVar2;
      if (*puStack_18 == 0) {
        player.mStance = kJumping;
      }
      else {
        player.mStance = kClimbing;
        player.mSpeed.mX = 0;
      }
      if (((*isOnStairs_local != 0) || (*puStack_18 == 0)) &&
         (player.mStance = kStanding, player.mSpeed.mX == 0)) {
        heroFrame = 0;
      }
      if (pos._4_4_ < 0) {
        pos._4_4_ = 0;
      }
      if ((player.mSpeed.mY != 0) && (player.mStance == kClimbing)) {
        heroFrame = (heroFrame + 1) % 2;
      }
      if (((player.mSpeed.mX != 0) && (*isOnStairs_local != 0)) || (player.mStance == kAltAttacking)
         ) {
        heroFrame = (heroFrame + 1) % 2;
      }
      if (*isOnStairs_local != 0) {
        player.mSpeed.mX = player.mSpeed.mX / 2;
        player.mPosition.mY = player.mPosition.mY / 0x20 << 5;
      }
      if ((*isOnStairs_local != 0) && (*puStack_18 == 0)) {
        player.mSpeed.mY = min(0,player.mSpeed.mY);
        player.mPosition.mY = min(player.mPosition.mY,player.mPosition.mY / 0x20 << 5);
      }
      if ((player.mSpeed.mY < 0) &&
         (foregroundTiles[pos._4_4_][(player.mPosition.mX + 0x10) / 0x20] == 1)) {
        player.mSpeed.mY = -player.mSpeed.mY;
      }
      if ((player.mSpeed.mY < 0) &&
         (foregroundTiles[player.mPosition.mY / 0x20][(player.mPosition.mX + 0x10) / 0x20] == 1)) {
        player.mSpeed.mY = -player.mSpeed.mY;
      }
      if (*puStack_18 == 0) {
        player.mSpeed.mY = player.mSpeed.mY + 2;
      }
      else {
        player.mSpeed.mY = 0;
      }
      for (pos2 = 0; pos2 < arrows.used; pos2 = pos2 + 1) {
        foe = (Actor *)arrows.items[pos2];
        if ((foe != (Actor *)0x0) && (foe->mActive != 0)) {
          (foe->mPosition).mX = (foe->mSpeed).mX + (foe->mPosition).mX;
          (foe->mPosition).mY = (foe->mSpeed).mY + (foe->mPosition).mY;
          if (((foe->mPosition).mX < 0x140) &&
             ((((-1 < (foe->mPosition).mX && (-1 < (foe->mPosition).mY)) &&
               ((foe->mPosition).mY < 200)) && (iVar2 = isBlockedByWall(foe), iVar2 == 0)))) {
            for (arrow = (Actor *)0x0; arrow < foes.used;
                arrow = (Actor *)((long)&(arrow->mPosition).mX + 1)) {
              item = (Item *)foes.items[(long)arrow];
              if ((((Actor *)item != (Actor *)0x0) && (((Actor *)item)->mActive != 0)) &&
                 ((((Actor *)item)->mType != kHand &&
                  (iVar2 = collideActorActor((Actor *)item,foe,0x20), iVar2 != 0)))) {
                item[1].mActive = item[1].mActive + -1;
                removeFromVector(&arrows,foe);
                free(foe);
                if (item[1].mPosition.mX == 5) {
                  openAllDoors();
                }
              }
            }
          }
          else {
            removeFromVector(&arrows,foe);
            free(foe);
          }
        }
      }
      for (pos2 = 0; pos2 < items.used; pos2 = pos2 + 1) {
        local_48 = (Item *)items.items[pos2];
        if (((local_48 != (Item *)0x0) && (local_48->mActive != 0)) &&
           (iVar2 = collideActorItem(&player,local_48,0x20), pcVar1 = pickSound, iVar2 != 0)) {
          if ((local_48->mType == kKey) && (hasKey == 0)) {
            hasKey = 1;
            local_48->mActive = 0;
            pcVar1 = pickSound;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_68,pcVar1,&local_69);
            playTune((string *)local_68);
            std::__cxx11::string::~string(local_68);
            std::allocator<char>::~allocator((allocator<char> *)&local_69);
            openAllDoors();
          }
          else if (local_48->mType == kMeat) {
            if (player.mHealth < 10) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
              playTune((string *)local_a0);
              std::__cxx11::string::~string(local_a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_a1);
              local_48->mActive = 0;
              pcVar1 = pickSound;
              player.mHealth = 10;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_c8,pcVar1,(allocator *)((long)&foe_1 + 7));
              playTune((string *)local_c8);
              std::__cxx11::string::~string(local_c8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&foe_1 + 7));
            }
            ticksToShowHealth = 0xe;
          }
        }
      }
      for (pos2 = 0; pos2 < foes.used; pos2 = pos2 + 1) {
        actor = (Actor *)foes.items[pos2];
        if ((actor != (Actor *)0x0) && (actor->mActive != 0)) {
          if (actor->mType == kSpawner) {
            if ((counter % 0x28 == 0) && (foes.used < 6)) {
              item_01 = (Vec2i *)calloc(1,0x24);
              pushVector(&foes,item_01);
              item_01[2].mX = 1;
              item_01[1].mX = 8;
              *item_01 = actor->mPosition;
              item_01[2].mY = 1;
              item_01[4].mX = 1;
              item_01[3].mY = 2;
            }
          }
          else {
            if ((counter % 5 == 0) && (actor->mType == kHand)) {
              iVar2 = player.mPosition.mY - (actor->mPosition).mY;
              if (player.mPosition.mX - (actor->mPosition).mX < 1) {
                (actor->mSpeed).mX = -1;
              }
              else {
                (actor->mSpeed).mX = 1;
              }
              if (iVar2 < 1) {
                (actor->mSpeed).mY = -1;
              }
              else {
                (actor->mSpeed).mY = 1;
              }
              if (actor->mDirection == kDirectionLeft) {
                if ((actor->mPosition).mX < 0xa0) {
                  (actor->mSpeed).mX = -(actor->mSpeed).mX;
                }
              }
              else if ((actor->mDirection == kDirectionRight) && (0x9f < (actor->mPosition).mX)) {
                (actor->mSpeed).mX = -(actor->mSpeed).mX;
              }
            }
            if ((((actor->mType == kSkeleton) || (actor->mType == kTinhoso)) ||
                (actor->mType == kCapiroto)) || (actor->mType == kHand)) {
              if (actor->mHealth < 1) {
                actor->mActive = 0;
                if (actor->mType == kCapiroto) {
                  screen = kVictory;
                  prepareScreenFor(kVictory);
                  return;
                }
                if (actor->mType == kTinhoso) {
                  hasBossOnScreen = 0;
                  clearVector(&doors);
                }
              }
              else if ((actor->mType == kSkeleton) || (actor->mType == kHand)) {
                (actor->mPosition).mX = (actor->mSpeed).mX + (actor->mPosition).mX;
                (actor->mPosition).mY = (actor->mSpeed).mY + (actor->mPosition).mY;
                if (0x11f < (actor->mPosition).mX) {
                  (actor->mSpeed).mX = -8;
                  actor->mDirection = kDirectionLeft;
                }
                if ((actor->mPosition).mX < 0) {
                  (actor->mSpeed).mX = 8;
                  actor->mDirection = kDirectionRight;
                }
                iVar2 = isBlockedByWall(actor);
                if (iVar2 != 0) {
                  (actor->mSpeed).mX = -(actor->mSpeed).mX;
                  if (actor->mDirection == kDirectionLeft) {
                    actor->mDirection = kDirectionRight;
                  }
                  else {
                    actor->mDirection = kDirectionLeft;
                  }
                }
                if ((ticksUntilVulnerable < 1) &&
                   (iVar2 = collideActorActor(actor,&player,0x10), iVar2 != 0)) {
                  hurtPlayer(1);
                }
                (actor->mSpeed).mY = (actor->mSpeed).mY + 2;
                iVar2 = isOnFloor(actor);
                if (iVar2 != 0) {
                  (actor->mSpeed).mY = 0;
                  (actor->mPosition).mY = (actor->mPosition).mY / 0x20 << 5;
                }
              }
            }
          }
        }
      }
      for (pos2 = 0; pos2 < foes.used; pos2 = pos2 + 1) {
        item_00 = foes.items[pos2];
        if (((item_00 != (void *)0x0) && (*(int *)((long)item_00 + 0x10) != 5)) &&
           (*(int *)((long)item_00 + 0x1c) < 1)) {
          removeFromVector(&foes,item_00);
        }
      }
    }
  }
  return;
}

Assistant:

void gameTick(int *isOnGround, int *isOnStairs) {
	int ceiling;
	size_t pos;
	size_t pos2 = 0;

	++counter;

	if (screen != kGame) {
		return;
	}

	updateTimers();

	if (player.mHealth == 0) {
		screen = kGameOver;
		prepareScreenFor(screen);
		return;
	}

	if (player.mStance == kAttacking) {
		evaluatePlayerAttack();

		player.mStance = kStanding;
	}

	*isOnStairs = (
			foregroundTiles[(player.mPosition.mY + 16) / 32][(player.mPosition.mX + 16) / 32] == 3);

	if (isBlockedByWall(&player)) {
		player.mSpeed.mX = 0;
	}

	if (isOnHarmfulBlock(&player) && ticksUntilVulnerable <= 0) {
		hurtPlayer(1);
	}

	if (isOnDoor(&player)) {
		advanceFloor();
	}

	player.mPosition.mX += player.mSpeed.mX;
	player.mPosition.mY += player.mSpeed.mY;

	if (player.mSpeed.mX == 1) {
		player.mSpeed.mX = 0;
	}

	if (player.mSpeed.mY == 1) {
		player.mSpeed.mY = 0;
	}

	enforceScreenLimits();

	if (player.mSpeed.mX == 0 && player.mSpeed.mY == 0 && player.mStance != kAltAttacking) {
		heroFrame = 0;
	}

	ceiling = (player.mPosition.mY) / 32;

	*isOnGround = isOnFloor(&player);

	if (*isOnStairs) {
		player.mStance = kClimbing;
		player.mSpeed.mX = 0;
	} else {
		player.mStance = kJumping;
	}

	if (*isOnGround || !*isOnStairs) {
		player.mStance = kStanding;

		if (player.mSpeed.mX == 0) {
			heroFrame = 0;
		}

	}

	if (ceiling < 0) {
		ceiling = 0;
	}

	if (player.mSpeed.mY != 0 && player.mStance == kClimbing) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if ((player.mSpeed.mX != 0 && *isOnGround) || player.mStance == kAltAttacking) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if (*isOnGround) {
		player.mSpeed.mX = player.mSpeed.mX / 2;
		player.mPosition.mY = (player.mPosition.mY / 32) * 32;
	}

	if (*isOnGround && !*isOnStairs) {
		player.mSpeed.mY = min(0, player.mSpeed.mY);
		player.mPosition.mY = min(player.mPosition.mY, (player.mPosition.mY / 32) * 32);
	}

	if (player.mSpeed.mY < 0 && foregroundTiles[ceiling][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (player.mSpeed.mY < 0 &&
		foregroundTiles[player.mPosition.mY / 32][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (!*isOnStairs) {
		player.mSpeed.mY = player.mSpeed.mY + 2;
/*this prevents from jumping while keeping the climbing animation state.
Unfortunately, prevents looking up.*/

	} else {
		player.mSpeed.mY = 0;
	}

	for (pos = 0; pos < arrows.used; ++pos) {
		struct Actor *arrow =  (struct Actor*)arrows.items[pos];

		if (arrow == NULL) {
			continue;
		}

		if (!arrow->mActive) {
			continue;
		}

		arrow->mPosition.mX += arrow->mSpeed.mX;
		arrow->mPosition.mY += arrow->mSpeed.mY;

		if (arrow->mPosition.mX >= 320 ||
			arrow->mPosition.mX < 0 ||
			arrow->mPosition.mY < 0 ||
			arrow->mPosition.mY >= 200 ||
			isBlockedByWall(arrow)) {

			removeFromVector(&arrows, arrow);
			free(arrow);
			continue;
		}

		for (pos2 = 0; pos2 < foes.used; ++pos2) {
			struct Actor *foe =  (struct Actor*)foes.items[pos2];

			if (foe == NULL || !foe->mActive) {
				continue;
			}

			if (foe->mType != kHand && collideActorActor(foe, arrow, DEFAULT_TOLERANCE)) {
				foe->mHealth--;
				removeFromVector(&arrows, arrow);
				free(arrow);


				if (foe->mType == kGargoyle) {
					openAllDoors();
				}
			}
		}
	}

	for (pos = 0; pos < items.used; ++pos) {

		struct Item *item =  (struct Item*)items.items[pos];

		if (item == NULL || !item->mActive) {
			continue;
		}

		if (collideActorItem(&player, item, DEFAULT_TOLERANCE)) {
			if (item->mType == kKey && !hasKey) {
				hasKey = TRUE;
				item->mActive = FALSE;
				playTune(pickSound);
				openAllDoors();

			} else if (item->mType == kMeat) {
				if (player.mHealth < 10) {
					playTune(pickSound);
					item->mActive = FALSE;
					player.mHealth = 10;
					playTune(pickSound);
				}
				ticksToShowHealth = 14;
			}
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe == NULL || !foe->mActive) {
			continue;
		}

		if (foe->mType == kSpawner) {
			if ((counter % 40) == 0 && (foes.used <= 5)) {
				struct Actor *a = (struct Actor *) calloc(1, sizeof(struct Actor));
				pushVector(&foes, a);
				a->mType = kSkeleton;
				a->mSpeed.mX = 8;
				a->mPosition = foe->mPosition;
				a->mDirection = kDirectionRight;
				a->mActive = TRUE;
				a->mHealth = 2;
			}
			continue;
		}


		if ((counter % 5) == 0 && foe->mType == kHand) {
			int dx = player.mPosition.mX - foe->mPosition.mX;
			int dy = player.mPosition.mY - foe->mPosition.mY;

			if (dx > 0) {
				foe->mSpeed.mX = 1;
			} else {
				foe->mSpeed.mX = -1;
			}

			if (dy > 0) {
				foe->mSpeed.mY = 1;
			} else {
				foe->mSpeed.mY = -1;
			}

			switch (foe->mDirection) {
				case kDirectionLeft:
					if (foe->mPosition.mX < 160) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
				case kDirectionRight:
					if (160 <= foe->mPosition.mX) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
			}
		}

		if (foe->mType != kSkeleton &&
			foe->mType != kTinhoso &&
			foe->mType != kCapiroto &&
			foe->mType != kHand) {

			continue;
		}

		if (foe->mHealth <= 0) {
			foe->mActive = FALSE;

			if (foe->mType == kCapiroto) {
				screen = kVictory;
				prepareScreenFor(screen);
				return;
			} else if (foe->mType == kTinhoso) {
				hasBossOnScreen = FALSE;

				clearVector(&doors);
			}

			continue;
		}

		if (foe->mType != kSkeleton && foe->mType != kHand) {
			continue;
		}

		foe->mPosition.mX += foe->mSpeed.mX;
		foe->mPosition.mY += foe->mSpeed.mY;

		if (foe->mPosition.mX >= (320 - 32)) {
			foe->mSpeed.mX = -8;
			foe->mDirection = kDirectionLeft;
		}

		if (foe->mPosition.mX < 0) {
			foe->mSpeed.mX = 8;
			foe->mDirection = kDirectionRight;
		}

		if (isBlockedByWall(foe)) {
			foe->mSpeed.mX *= -1;

			if (foe->mDirection == kDirectionLeft) {
				foe->mDirection = kDirectionRight;
			} else {
				foe->mDirection = kDirectionLeft;
			}
		}

		if ((ticksUntilVulnerable <= 0) && collideActorActor(foe, &player, 16)) {
			hurtPlayer(1);
		}

		foe->mSpeed.mY += 2;

		if (isOnFloor(foe)) {
			foe->mSpeed.mY = 0;
			foe->mPosition.mY = (foe->mPosition.mY / 32) * 32;
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe != NULL && foe->mType != kGargoyle && foe->mHealth <= 0) {
			removeFromVector(&foes, foe);
		}
	}
}